

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::IfGenerateSyntax::IfGenerateSyntax
          (IfGenerateSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token keyword,Token openParen,ExpressionSyntax *condition,Token closeParen,
          MemberSyntax *block,ElseClauseSyntax *elseClause)

{
  ExpressionSyntax *pEVar1;
  MemberSyntax *pMVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  MemberSyntax *local_38;
  
  uVar4 = openParen._0_8_;
  uVar3 = keyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,IfGenerate,attributes);
  (this->keyword).kind = (short)uVar3;
  (this->keyword).field_0x2 = (char)((ulong)uVar3 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar3 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar3 >> 0x20);
  (this->keyword).info = keyword.info;
  (this->openParen).kind = (short)uVar4;
  (this->openParen).field_0x2 = (char)((ulong)uVar4 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar4 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar4 >> 0x20);
  (this->openParen).info = openParen.info;
  local_38 = (MemberSyntax *)condition;
  not_null<slang::syntax::ExpressionSyntax*>::not_null<slang::syntax::ExpressionSyntax*,void>
            ((not_null<slang::syntax::ExpressionSyntax*> *)&this->condition,
             (ExpressionSyntax **)&local_38);
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  local_38 = block;
  not_null<slang::syntax::MemberSyntax*>::not_null<slang::syntax::MemberSyntax*,void>
            ((not_null<slang::syntax::MemberSyntax*> *)&this->block,&local_38);
  this->elseClause = elseClause;
  pEVar1 = not_null<slang::syntax::ExpressionSyntax_*>::get(&this->condition);
  (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)this;
  pMVar2 = not_null<slang::syntax::MemberSyntax_*>::get(&this->block);
  (pMVar2->super_SyntaxNode).parent = (SyntaxNode *)this;
  if (this->elseClause != (ElseClauseSyntax *)0x0) {
    (this->elseClause->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

IfGenerateSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token openParen, ExpressionSyntax& condition, Token closeParen, MemberSyntax& block, ElseClauseSyntax* elseClause) :
        MemberSyntax(SyntaxKind::IfGenerate, attributes), keyword(keyword), openParen(openParen), condition(&condition), closeParen(closeParen), block(&block), elseClause(elseClause) {
        this->condition->parent = this;
        this->block->parent = this;
        if (this->elseClause) this->elseClause->parent = this;
    }